

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SPPParameter::SharedCtor(SPPParameter *this)

{
  this->_cached_size_ = 0;
  this->pyramid_height_ = 0;
  this->pool_ = 0;
  this->engine_ = 0;
  return;
}

Assistant:

void SPPParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&pyramid_height_, 0, reinterpret_cast<char*>(&engine_) -
    reinterpret_cast<char*>(&pyramid_height_) + sizeof(engine_));
}